

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseSourceName(State *state)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  bool bVar5;
  State *in_RDI;
  int *in_stack_00000010;
  State *in_stack_00000018;
  int length;
  ParseState copy;
  ComplexityGuard guard;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  ComplexityGuard in_stack_ffffffffffffffe8;
  bool local_1;
  
  anon_unknown_3::ComplexityGuard::ComplexityGuard
            ((ComplexityGuard *)&stack0xffffffffffffffe8,in_RDI);
  bVar5 = anon_unknown_3::ComplexityGuard::IsTooComplex((ComplexityGuard *)&stack0xffffffffffffffe8)
  ;
  if (bVar5) {
    local_1 = false;
  }
  else {
    iVar1 = (in_RDI->parse_state).mangled_idx;
    iVar2 = (in_RDI->parse_state).out_cur_idx;
    iVar3 = (in_RDI->parse_state).prev_name_idx;
    uVar4 = *(undefined4 *)&(in_RDI->parse_state).field_0xc;
    bVar5 = ParseNumber(in_stack_00000018,in_stack_00000010);
    if ((bVar5) &&
       (bVar5 = ParseIdentifier(in_stack_ffffffffffffffe8.state_,
                                CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)),
       bVar5)) {
      local_1 = true;
    }
    else {
      (in_RDI->parse_state).mangled_idx = iVar1;
      (in_RDI->parse_state).out_cur_idx = iVar2;
      (in_RDI->parse_state).prev_name_idx = iVar3;
      *(undefined4 *)&(in_RDI->parse_state).field_0xc = uVar4;
      local_1 = false;
    }
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard((ComplexityGuard *)&stack0xffffffffffffffe8);
  return local_1;
}

Assistant:

static bool ParseSourceName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  int length = -1;
  if (ParseNumber(state, &length) &&
      ParseIdentifier(state, static_cast<size_t>(length))) {
    return true;
  }
  state->parse_state = copy;
  return false;
}